

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DecodeDoclist(int *pRc,Fts5Buffer *pBuf,u8 *a,int n)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint local_64;
  u64 local_48;
  i64 iDelta;
  uint local_38;
  int bDel;
  int nPos;
  int iOff;
  i64 iDocid;
  u8 *puStack_20;
  int n_local;
  u8 *a_local;
  Fts5Buffer *pBuf_local;
  int *pRc_local;
  
  _nPos = 0;
  bDel = 0;
  iDocid._4_4_ = n;
  puStack_20 = a;
  a_local = (u8 *)pBuf;
  pBuf_local = (Fts5Buffer *)pRc;
  if (0 < n) {
    bVar1 = sqlite3Fts5GetVarint(a,(u64 *)&nPos);
    bDel = (int)bVar1;
    sqlite3Fts5BufferAppendPrintf((int *)pBuf_local,(Fts5Buffer *)a_local," id=%lld",_nPos);
  }
  while (bDel < iDocid._4_4_) {
    iVar2 = fts5GetPoslistSize(puStack_20 + bDel,(int *)&local_38,(int *)((long)&iDelta + 4));
    bDel = iVar2 + bDel;
    pcVar3 = "";
    if (iDelta._4_4_ != 0) {
      pcVar3 = "*";
    }
    sqlite3Fts5BufferAppendPrintf
              ((int *)pBuf_local,(Fts5Buffer *)a_local," nPos=%d%s",(ulong)local_38,pcVar3);
    if (iDocid._4_4_ - bDel < (int)local_38) {
      local_64 = iDocid._4_4_ - bDel;
    }
    else {
      local_64 = local_38;
    }
    iVar2 = fts5DecodePoslist((int *)pBuf_local,(Fts5Buffer *)a_local,puStack_20 + bDel,local_64);
    bDel = iVar2 + bDel;
    if (bDel < iDocid._4_4_) {
      bVar1 = sqlite3Fts5GetVarint(puStack_20 + bDel,&local_48);
      bDel = (uint)bVar1 + bDel;
      _nPos = local_48 + _nPos;
      sqlite3Fts5BufferAppendPrintf((int *)pBuf_local,(Fts5Buffer *)a_local," id=%lld",_nPos);
    }
  }
  return bDel;
}

Assistant:

static int fts5DecodeDoclist(int *pRc, Fts5Buffer *pBuf, const u8 *a, int n){
  i64 iDocid = 0;
  int iOff = 0;

  if( n>0 ){
    iOff = sqlite3Fts5GetVarint(a, (u64*)&iDocid);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
  }
  while( iOff<n ){
    int nPos;
    int bDel;
    iOff += fts5GetPoslistSize(&a[iOff], &nPos, &bDel);
    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " nPos=%d%s", nPos, bDel?"*":"");
    iOff += fts5DecodePoslist(pRc, pBuf, &a[iOff], MIN(n-iOff, nPos));
    if( iOff<n ){
      i64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&iDelta);
      iDocid += iDelta;
      sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " id=%lld", iDocid);
    }
  }

  return iOff;
}